

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_common.c
# Opt level: O3

_Bool tree_iterator_nextn(void *Iterator,size_t count)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  lVar3 = *(long *)((long)Iterator + 8);
  if (count != 0 && lVar3 != 0) {
    do {
      lVar2 = lVar3;
      lVar1 = *(long *)(lVar3 + 0x20);
      if (*(long *)(lVar3 + 0x20) == 0) {
        do {
          lVar3 = *(long *)(lVar2 + 0x10);
          if (lVar3 == 0) {
            lVar3 = 0;
            goto LAB_0010619c;
          }
          bVar4 = *(long *)(lVar3 + 0x20) == lVar2;
          lVar2 = lVar3;
        } while (bVar4);
      }
      else {
        do {
          lVar3 = lVar1;
          lVar1 = *(long *)(lVar3 + 0x18);
        } while (*(long *)(lVar3 + 0x18) != 0);
      }
      count = count - 1;
    } while (count != 0);
LAB_0010619c:
    *(long *)((long)Iterator + 8) = lVar3;
  }
  return lVar3 != 0;
}

Assistant:

bool
tree_iterator_nextn(void* Iterator, size_t count)
{
    tree_iterator* iterator = Iterator;
    while (iterator->node && count--)
	iterator->node = tree_node_next(iterator->node);
    return iterator->node != NULL;
}